

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O3

void __thiscall
duckdb::DataTable::VerifyUpdateConstraints
          (DataTable *this,ConstraintState *state,ClientContext *context,DataChunk *chunk,
          vector<duckdb::PhysicalIndex,_true> *column_ids)

{
  ConstraintType CVar1;
  TableCatalogEntry *this_00;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *this_01;
  idx_t count;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *this_02;
  const_reference this_03;
  const_reference this_04;
  pointer pBVar2;
  BoundNotNullConstraint *pBVar3;
  pointer pCVar4;
  NotNullConstraint *pNVar5;
  const_reference pvVar6;
  CheckConstraint *check;
  BoundCheckConstraint *pBVar7;
  __node_base_ptr p_Var8;
  reference other;
  type expr;
  ColumnDefinition *this_05;
  reference pvVar9;
  string *col_name;
  NotImplementedException *this_06;
  InternalException *this_07;
  ulong uVar10;
  size_type sVar11;
  size_type sVar12;
  size_type __n;
  DataChunk mock_chunk;
  undefined1 local_90 [32];
  undefined1 local_70 [64];
  
  this_00 = state->table;
  this_02 = TableCatalogEntry::GetConstraints(this_00);
  this_01 = state->bound_constraints;
  if ((this_01->
      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this_01->
      super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ).
      super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::operator[](this_02,__n);
      this_04 = vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                ::operator[](this_01,__n);
      pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
               ::operator->(this_04);
      CVar1 = pBVar2->type;
      if (1 < CVar1 - 3) {
        if (CVar1 == CHECK) {
          pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_03);
          check = Constraint::Cast<duckdb::CheckConstraint>(pCVar4);
          pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                   ::operator->(this_04);
          pBVar7 = BoundConstraint::Cast<duckdb::BoundCheckConstraint>(pBVar2);
          DataChunk::DataChunk((DataChunk *)local_70);
          if ((column_ids->
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (column_ids->
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            sVar12 = 0;
            sVar11 = 0;
            do {
              pvVar6 = vector<duckdb::PhysicalIndex,_true>::operator[](column_ids,sVar12);
              p_Var8 = ::std::
                       _Hashtable<duckdb::PhysicalIndex,_duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::PhysicalIndex>,_duckdb::PhysicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::_M_find_before_node
                                 (&(pBVar7->bound_columns)._M_h,
                                  pvVar6->index % (pBVar7->bound_columns)._M_h._M_bucket_count,
                                  pvVar6,pvVar6->index);
              uVar10 = 0;
              if (p_Var8 != (__node_base_ptr)0x0) {
                uVar10 = (ulong)(p_Var8->_M_nxt != (_Hash_node_base *)0x0);
              }
              sVar11 = sVar11 + uVar10;
              sVar12 = sVar12 + 1;
            } while (sVar12 < (ulong)((long)(column_ids->
                                            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ).
                                            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(column_ids->
                                            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ).
                                            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
            if (sVar11 != 0) {
              if (sVar11 != (pBVar7->bound_columns)._M_h._M_element_count) {
                this_07 = (InternalException *)__cxa_allocate_exception(0x10);
                local_90._0_8_ = local_90 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_90,
                           "Not all columns required for the CHECK constraint are present in the UPDATED chunk!"
                           ,"");
                InternalException::InternalException(this_07,(string *)local_90);
                __cxa_throw(this_07,&InternalException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              TableCatalogEntry::GetTypes((vector<duckdb::LogicalType,_true> *)local_90,this_00);
              DataChunk::InitializeEmpty
                        ((DataChunk *)local_70,(vector<duckdb::LogicalType,_true> *)local_90);
              if ((column_ids->
                  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
                  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_finish !=
                  (column_ids->
                  super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
                  super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                sVar12 = 0;
                do {
                  pvVar6 = vector<duckdb::PhysicalIndex,_true>::operator[](column_ids,sVar12);
                  pvVar9 = vector<duckdb::Vector,_true>::operator[]
                                     ((vector<duckdb::Vector,_true> *)local_70,pvVar6->index);
                  other = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar12);
                  Vector::Reference(pvVar9,other);
                  sVar12 = sVar12 + 1;
                } while (sVar12 < (ulong)((long)(column_ids->
                                                super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                                ).
                                                super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(column_ids->
                                                super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                                ).
                                                super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 3));
              }
              local_70._24_8_ = chunk->count;
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                        ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                         local_90);
              expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator*(&pBVar7->expression);
              VerifyCheckConstraint(context,this_00,expr,(DataChunk *)local_70,check);
            }
          }
          DataChunk::~DataChunk((DataChunk *)local_70);
        }
        else {
          if (CVar1 != NOT_NULL) {
            this_06 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_70._0_8_ = local_70 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,"Constraint type not implemented!","");
            NotImplementedException::NotImplementedException(this_06,(string *)local_70);
            __cxa_throw(this_06,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pBVar2 = unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>
                   ::operator->(this_04);
          pBVar3 = BoundConstraint::Cast<duckdb::BoundNotNullConstraint>(pBVar2);
          pCVar4 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                   operator->(this_03);
          pNVar5 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar4);
          if ((column_ids->
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              (column_ids->
              super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>).
              super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            sVar12 = 0;
            do {
              pvVar6 = vector<duckdb::PhysicalIndex,_true>::operator[](column_ids,sVar12);
              if (pvVar6->index == (pBVar3->index).index) {
                this_05 = TableCatalogEntry::GetColumn(this_00,(LogicalIndex)(pNVar5->index).index);
                pvVar9 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar12);
                count = chunk->count;
                col_name = ColumnDefinition::Name_abi_cxx11_(this_05);
                VerifyNotNullConstraint(this_00,pvVar9,count,col_name);
                break;
              }
              sVar12 = sVar12 + 1;
            } while (sVar12 < (ulong)((long)(column_ids->
                                            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ).
                                            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(column_ids->
                                            super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ).
                                            super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_01->
                                 super_vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                                 ).
                                 super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void DataTable::VerifyUpdateConstraints(ConstraintState &state, ClientContext &context, DataChunk &chunk,
                                        const vector<PhysicalIndex> &column_ids) {
	auto &table = state.table;
	auto &constraints = table.GetConstraints();
	auto &bound_constraints = state.bound_constraints;
	for (idx_t constr_idx = 0; constr_idx < bound_constraints.size(); constr_idx++) {
		auto &base_constraint = constraints[constr_idx];
		auto &constraint = bound_constraints[constr_idx];
		switch (constraint->type) {
		case ConstraintType::NOT_NULL: {
			auto &bound_not_null = constraint->Cast<BoundNotNullConstraint>();
			auto &not_null = base_constraint->Cast<NotNullConstraint>();
			// check if the constraint is in the list of column_ids
			for (idx_t col_idx = 0; col_idx < column_ids.size(); col_idx++) {
				if (column_ids[col_idx] == bound_not_null.index) {
					// found the column id: check the data in
					auto &col = table.GetColumn(LogicalIndex(not_null.index));
					VerifyNotNullConstraint(table, chunk.data[col_idx], chunk.size(), col.Name());
					break;
				}
			}
			break;
		}
		case ConstraintType::CHECK: {
			auto &check = base_constraint->Cast<CheckConstraint>();
			auto &bound_check = constraint->Cast<BoundCheckConstraint>();

			DataChunk mock_chunk;
			if (CreateMockChunk(table, column_ids, bound_check.bound_columns, chunk, mock_chunk)) {
				VerifyCheckConstraint(context, table, *bound_check.expression, mock_chunk, check);
			}
			break;
		}
		case ConstraintType::UNIQUE:
		case ConstraintType::FOREIGN_KEY:
			break;
		default:
			throw NotImplementedException("Constraint type not implemented!");
		}
	}

#ifdef DEBUG
	// Ensure that we never call UPDATE for indexed columns.
	// Instead, we must rewrite these updates into DELETE + INSERT.
	info->indexes.Scan([&](Index &index) {
		D_ASSERT(index.IsBound());
		D_ASSERT(!index.Cast<BoundIndex>().IndexIsUpdated(column_ids));
		return false;
	});
#endif
}